

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::cpp::OneofCaseConstantName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  LogMessage *other;
  string field_name;
  LogFinisher local_51;
  undefined1 *local_50 [2];
  int local_40 [10];
  
  if ((((byte)this[1] & 0x10) == 0) || (*(long *)(this + 0x28) == 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1c9);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_50,"CHECK failed: field->containing_oneof(): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  UnderscoresToCamelCase((string *)local_50,*(string **)(this + 8),true);
  std::operator+(__return_storage_ptr__,"k",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  if ((int *)local_50[0] != &((LogMessage *)local_50)->line_) {
    operator_delete(local_50[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OneofCaseConstantName(const FieldDescriptor* field) {
  GOOGLE_DCHECK(field->containing_oneof());
  std::string field_name = UnderscoresToCamelCase(field->name(), true);
  return "k" + field_name;
}